

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

DDSInfo * __thiscall DDSInfo::PrintResourceDimensionFlagNames_abi_cxx11_(DDSInfo *this,uint flags)

{
  pointer ppVar1;
  key_type local_b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [36];
  key_type local_84;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [52];
  key_type local_44;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [35];
  undefined1 local_15;
  uint local_14;
  DDSInfo *pDStack_10;
  uint flags_local;
  string *output;
  
  local_15 = 0;
  local_14 = flags;
  pDStack_10 = this;
  std::__cxx11::string::string((string *)this);
  if ((local_14 & 2) != 0) {
    local_44 = 2;
    local_40._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)resource_dimension_names_abi_cxx11_,&local_44);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::operator+(local_38,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((local_14 & 3) != 0) {
    local_84 = 3;
    local_80._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)resource_dimension_names_abi_cxx11_,&local_84);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_80);
    std::operator+(local_78,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_14 & 4) != 0) {
    local_b4 = 4;
    local_b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)resource_dimension_names_abi_cxx11_,&local_b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    std::operator+(local_a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_a8);
  }
  RemoveTrailingCharacter((string *)this,'|');
  return this;
}

Assistant:

std::string PrintResourceDimensionFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,resource_dimension_names)
    #include "defs/dds/texture_dimension.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }